

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
on_hex(int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  char cVar1;
  uint uVar2;
  undefined1 n [16];
  anon_class_16_2_cb75083a_for_f_conflict1 f;
  int num_digits_00;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> bVar3;
  string_view prefix;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uStack_4c;
  int num_digits;
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
  *this_local;
  
  if ((char)this->specs->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = this->specs->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  n._8_8_ = in_stack_ffffffffffffff90;
  n._0_8_ = in_stack_ffffffffffffff88;
  num_digits_00 =
       count_digits<4u,unsigned__int128>(*(detail **)&this->abs_value,(unsigned___int128)n);
  bVar3.container = (this->out).container;
  prefix = get_prefix(this);
  f._12_4_ = uStack_4c;
  f.num_digits = num_digits_00;
  f.this = this;
  bVar3 = write_int<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>::on_hex()::_lambda(char*)_1_>
                    (bVar3,num_digits_00,prefix,this->specs,f);
  (this->out).container = bVar3.container;
  return;
}

Assistant:

void on_hex() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = specs.type;
    }
    int num_digits = count_digits<4>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<4, Char>(it, abs_value, num_digits,
                                                  specs.type != 'x');
                    });
  }